

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

interresult __thiscall
tetgenmesh::sscoutsegment
          (tetgenmesh *this,face *searchsh,point endpt,int insertsegflag,int reporterrorflag,
          int chkencflag)

{
  tetgenmesh *pa;
  shellface ppdVar1;
  shellface *pppdVar2;
  int iVar3;
  shellface *pppdVar4;
  undefined4 *puVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  shellface ppdVar10;
  char *pcVar11;
  int *this_00;
  face *flipfaces;
  shellface ppdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double *tq_00;
  face flipshs [2];
  face newseg;
  undefined8 local_68;
  double tq;
  double tp;
  double Q [3];
  
code_r0x0012da8e:
  flipshs[0].sh = (shellface *)0x0;
  flipshs[1].sh = (shellface *)0x0;
  flipshs[1].shver = 0;
  pppdVar4 = searchsh->sh;
  lVar6 = (long)searchsh->shver;
  pa = (tetgenmesh *)pppdVar4[sorgpivot[lVar6]];
  this_00 = (int *)this;
  if (2 < this->b->verbose) {
    pcVar11 = "      Scout segment (%d, %d).\n";
    printf("      Scout segment (%d, %d).\n",
           (ulong)*(uint *)((long)&pa->in + (long)this->pointmarkindex * 4),
           (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
    pppdVar4 = searchsh->sh;
    lVar6 = (long)searchsh->shver;
    this_00 = (int *)pcVar11;
  }
  ppdVar12 = pppdVar4[sdestpivot[lVar6]];
  if (ppdVar12 == (shellface)endpt) {
LAB_0012de38:
    if (insertsegflag != 0) {
      newseg.sh = (shellface *)0x0;
      newseg.shver = 0;
      makeshellface(this,this->subsegs,&newseg);
      uVar7 = (ulong)newseg.shver;
      newseg.sh[sorgpivot[uVar7]] = (shellface)pa;
      newseg.sh[sdestpivot[uVar7]] = (shellface)endpt;
      newseg.sh[sapexpivot[uVar7]] = (shellface)0x0;
      *(undefined4 *)((long)newseg.sh + (long)this->shmarkindex * 4) = 0xffffffff;
      iVar3 = searchsh->shver;
      lVar6 = (long)(iVar3 >> 1);
      searchsh->sh[lVar6 + 6] = (shellface)(uVar7 | (ulong)newseg.sh);
      *newseg.sh = (shellface)((long)iVar3 | (ulong)searchsh->sh);
      ppdVar12 = searchsh->sh[lVar6];
      if (((ulong)ppdVar12 & 0xfffffffffffffff8) != 0) {
        *(shellface *)
         (((ulong)ppdVar12 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)ppdVar12 & 6) * 4) =
             (shellface)(uVar7 | (ulong)newseg.sh);
        *newseg.sh = ppdVar12;
      }
      return SHAREEDGE;
    }
    return SHAREEDGE;
  }
  dVar13 = *endpt - (double)pa->in;
  dVar14 = endpt[1] - (double)pa->addin;
  dVar15 = endpt[2] - (double)pa->b;
  dVar13 = SQRT(dVar15 * dVar15 + dVar13 * dVar13 + dVar14 * dVar14);
  do {
    ppdVar1 = pppdVar4[sapexpivot[lVar6]];
    if (ppdVar1 == (shellface)endpt) {
      searchsh->shver = snextpivot[snextpivot[lVar6]] ^ 1;
      goto LAB_0012de38;
    }
    dVar14 = triarea((tetgenmesh *)this_00,(double *)pa,(double *)ppdVar12,endpt);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    dVar15 = 0.0;
    if (this->b->epsilon <= dVar14 / dVar13) {
      this_00 = (int *)pa;
      dVar15 = orient3d((double *)pa,(double *)ppdVar12,this->dummypoint,endpt);
    }
    dVar14 = triarea((tetgenmesh *)this_00,(double *)ppdVar1,(double *)pa,endpt);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    if (this->b->epsilon <= dVar14 / dVar13) {
      tq_00 = (double *)0x12dc46;
      dVar14 = orient3d((double *)ppdVar1,(double *)pa,this->dummypoint,endpt);
      if (0.0 <= dVar15) {
        if (0.0 <= dVar14) break;
      }
      else if ((0.0 <= dVar14) ||
              (uVar7 = (this->randomseed * 0x556 + 0x24d69) % 0xae529, this->randomseed = uVar7,
              (uVar7 & 1) == 0)) goto LAB_0012dc9c;
      iVar3 = snextpivot[snextpivot[searchsh->shver]];
      pppdVar2 = searchsh->sh;
      lVar6 = (long)(iVar3 >> 1);
      iVar8 = searchsh->shver >> 1;
      if (chkencflag == 0) {
        ppdVar10 = pppdVar2[lVar6];
        pppdVar4 = (shellface *)((ulong)ppdVar10 & 0xfffffffffffffff8);
        if (pppdVar4 != (shellface *)0x0) {
LAB_0012ddae:
          uVar9 = (uint)ppdVar10 & 7;
          uVar9 = pppdVar4[sdestpivot[uVar9]] != ppdVar1 ^ uVar9;
          goto LAB_0012ddc7;
        }
      }
      else {
        if (pppdVar2[lVar6 + 6] != (shellface)0x0) goto LAB_0012df95;
        ppdVar10 = pppdVar2[lVar6];
        pppdVar4 = (shellface *)((ulong)ppdVar10 & 0xfffffffffffffff8);
        if (pppdVar4 != (shellface *)0x0) goto LAB_0012ddae;
        if (pppdVar2[(long)iVar8 + 6] != (shellface)0x0) {
          return ACROSSEDGE;
        }
      }
      uVar9 = (uint)pppdVar2[iVar8] & 7;
      pppdVar4 = (shellface *)((ulong)pppdVar2[iVar8] & 0xfffffffffffffff8);
      ppdVar1 = pppdVar4[sorgpivot[uVar9]];
      searchsh->sh = pppdVar4;
      uVar9 = snextpivot[ppdVar1 != ppdVar12 ^ uVar9];
    }
    else {
      if (0.0 <= dVar15) {
        if (dVar15 <= 0.0) goto LAB_0012e0c0;
        goto LAB_0012defa;
      }
LAB_0012dc9c:
      pppdVar2 = searchsh->sh;
      lVar6 = (long)(searchsh->shver >> 1);
      if ((chkencflag != 0) && (pppdVar2[lVar6 + 6] != (shellface)0x0)) {
        return ACROSSEDGE;
      }
      pppdVar4 = (shellface *)((ulong)pppdVar2[lVar6] & 0xfffffffffffffff8);
      if (pppdVar4 == (shellface *)0x0) {
        iVar3 = snextpivot[snextpivot[searchsh->shver]];
        if ((chkencflag != 0) && (pppdVar2[(long)(iVar3 >> 1) + 6] != (shellface)0x0)) {
LAB_0012df95:
          searchsh->shver = iVar3;
          return ACROSSEDGE;
        }
        uVar9 = (uint)pppdVar2[iVar3 >> 1] & 7;
        pppdVar4 = (shellface *)((ulong)pppdVar2[iVar3 >> 1] & 0xfffffffffffffff8);
        uVar9 = pppdVar4[sdestpivot[uVar9]] != ppdVar1 ^ uVar9;
LAB_0012ddc7:
        searchsh->sh = pppdVar4;
      }
      else {
        uVar9 = (uint)pppdVar2[lVar6] & 7;
        ppdVar1 = pppdVar4[sorgpivot[uVar9]];
        searchsh->sh = pppdVar4;
        uVar9 = snextpivot[ppdVar1 != ppdVar12 ^ uVar9];
      }
    }
    this_00 = sdestpivot;
    searchsh->shver = uVar9;
    lVar6 = (long)(int)uVar9;
    ppdVar12 = pppdVar4[sdestpivot[lVar6]];
    if (ppdVar12 == (shellface)endpt) goto LAB_0012de38;
  } while( true );
  if (dVar15 <= 0.0) {
    if (dVar14 <= 0.0) {
LAB_0012e0c0:
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 2;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
  }
  else {
    if (0.0 < dVar14) {
      flipshs[0].sh = searchsh->sh;
      flipshs[0].shver = snextpivot[searchsh->shver];
      if (flipshs[0].sh[(long)(flipshs[0].shver >> 1) + 6] != (shellface)0x0) {
        if (reporterrorflag != 0) {
          tp = 0.0;
          tq = 0.0;
          linelineint(this,(double *)pa,endpt,(double *)ppdVar12,(double *)ppdVar1,(double *)&newseg
                      ,&tp,&tq,tq_00);
          printf("PLC Error:  Two segments intersect at point (%g,%g,%g),",newseg.sh,
                 CONCAT44(newseg._12_4_,newseg.shver),local_68);
          printf(" in facet #%d.\n",
                 (ulong)*(uint *)((long)searchsh->sh + (long)this->shmarkindex * 4));
          printf("  Segment 1: [%d, %d]\n",
                 (ulong)*(uint *)((long)ppdVar12 + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)ppdVar1 + (long)this->pointmarkindex * 4));
          printf("  Segment 2: [%d, %d]\n",
                 (ulong)*(uint *)((long)&pa->in + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
        }
        return ACROSSEDGE;
      }
      flipshs[1].shver = (uint)flipshs[0].sh[flipshs[0].shver >> 1] & 7;
      flipshs[1].sh =
           (shellface *)((ulong)flipshs[0].sh[flipshs[0].shver >> 1] & 0xfffffffffffffff8);
      if (flipshs[1].sh[sorgpivot[(uint)flipshs[1].shver]] !=
          flipshs[0].sh[sdestpivot[flipshs[0].shver]]) {
        flipshs[1].shver = flipshs[1].shver ^ 1;
      }
      flipfaces = flipshs;
      flip22(this,flipfaces,1,0);
      iVar3 = flipshs[0].shver;
      pppdVar4 = flipshs[0].sh;
      ppdVar12 = flipshs[1].sh[sapexpivot[flipshs[1].shver]];
      lVar6 = (long)flipshs[0].shver;
      ppdVar1 = flipshs[0].sh[sorgpivot[lVar6]];
      ppdVar10 = flipshs[0].sh[sdestpivot[lVar6]];
      dVar13 = orient3d((double *)ppdVar1,(double *)ppdVar10,this->dummypoint,
                        (double *)flipshs[0].sh[sapexpivot[lVar6]]);
      dVar14 = orient3d((double *)ppdVar10,(double *)ppdVar1,this->dummypoint,(double *)ppdVar12);
      if ((dVar13 <= 0.0) || (flipfaces = flipshs + 1, dVar14 <= 0.0)) {
        flipshpush(this,flipfaces);
      }
      searchsh->sh = pppdVar4;
      searchsh->shver = iVar3;
      goto code_r0x0012da8e;
    }
LAB_0012defa:
    searchsh->shver = snextpivot[snextpivot[searchsh->shver]] ^ 1;
  }
  if (reporterrorflag != 0) {
    ppdVar12 = searchsh->sh[sdestpivot[searchsh->shver]];
    printf("PLC Error:  A vertex lies in a segment in facet #%d.\n",
           (ulong)*(uint *)((long)searchsh->sh + (long)this->shmarkindex * 4));
    printf("  Vertex:  [%d] (%g,%g,%g).\n",*ppdVar12,ppdVar12[1],ppdVar12[2],
           (ulong)*(uint *)((long)ppdVar12 + (long)this->pointmarkindex * 4));
    printf("  Segment: [%d, %d]\n",(ulong)*(uint *)((long)&pa->in + (long)this->pointmarkindex * 4),
           (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
    return ACROSSVERT;
  }
  return ACROSSVERT;
}

Assistant:

enum tetgenmesh::interresult tetgenmesh::sscoutsegment(face *searchsh, 
  point endpt, int insertsegflag, int reporterrorflag, int chkencflag)
{
  face flipshs[2], neighsh;
  point startpt, pa, pb, pc, pd;
  enum interresult dir;
  enum {MOVE_AB, MOVE_CA} nextmove;
  REAL ori_ab, ori_ca, len;

  // The origin of 'searchsh' is fixed.
  startpt = sorg(*searchsh); 
  nextmove = MOVE_AB; // Avoid compiler warning.

  if (b->verbose > 2) {
    printf("      Scout segment (%d, %d).\n", pointmark(startpt),
           pointmark(endpt));
  }
  len = distance(startpt, endpt);

  // Search an edge in 'searchsh' on the path of this segment.
  while (1) {

    pb = sdest(*searchsh);
    if (pb == endpt) {
      dir = SHAREEDGE; // Found!
      break;
    }

    pc = sapex(*searchsh);
    if (pc == endpt) {
      senext2self(*searchsh);
      sesymself(*searchsh);
      dir = SHAREEDGE; // Found!
      break;
    }


    // Round the results.
    if ((sqrt(triarea(startpt, pb, endpt)) / len) < b->epsilon) {
      ori_ab = 0.0;
    } else {
      ori_ab = orient3d(startpt, pb, dummypoint, endpt);
    }
    if ((sqrt(triarea(pc, startpt, endpt)) / len) < b->epsilon) {
      ori_ca = 0.0;
    } else {
      ori_ca = orient3d(pc, startpt, dummypoint, endpt);
    }

    if (ori_ab < 0) {
      if (ori_ca < 0) { // (--)
        // Both sides are viable moves.
        if (randomnation(2)) {
          nextmove = MOVE_CA;
        } else {
          nextmove = MOVE_AB;
        }
      } else { // (-#)
        nextmove = MOVE_AB;
      }
    } else {
      if (ori_ca < 0) { // (#-)
        nextmove = MOVE_CA;
      } else {
        if (ori_ab > 0) {
          if (ori_ca > 0) { // (++)
            // The segment intersects with edge [b, c].
            dir = ACROSSEDGE;
            break;
          } else { // (+0)
            // The segment collinear with edge [c, a].
            senext2self(*searchsh);
            sesymself(*searchsh); 
            dir = ACROSSVERT;
            break;
          }
        } else {
          if (ori_ca > 0) { // (0+)
            // The segment is collinear with edge [a, b].
            dir = ACROSSVERT;
            break;
          } else { // (00)
            // startpt == endpt. Not possible.
            terminatetetgen(this, 2);
          }
        }
      }
    }

    // Move 'searchsh' to the next face, keep the origin unchanged.
    if (nextmove == MOVE_AB) {
      if (chkencflag) {
        // Do not cross boundary.
        if (isshsubseg(*searchsh)) {
          return ACROSSEDGE; // ACROSS_SEG
        }
      }
      spivot(*searchsh, neighsh);
      if (neighsh.sh != NULL) {
        if (sorg(neighsh) != pb) sesymself(neighsh);
        senext(neighsh, *searchsh);
      } else {
        // This side (startpt->pb) is outside. It is caused by rounding error.
        // Try the next side, i.e., (pc->startpt).
        senext2(*searchsh, neighsh);
        if (chkencflag) {
          // Do not cross boundary.
          if (isshsubseg(neighsh)) {
            *searchsh = neighsh;
            return ACROSSEDGE; // ACROSS_SEG
          }
        }
        spivotself(neighsh);
        if (sdest(neighsh) != pc) sesymself(neighsh);
        *searchsh = neighsh;
      }
    } else { // MOVE_CA
      senext2(*searchsh, neighsh);
      if (chkencflag) {
        // Do not cross boundary.
        if (isshsubseg(neighsh)) {
          *searchsh = neighsh;
          return ACROSSEDGE; // ACROSS_SEG
        }
      }
      spivotself(neighsh);
      if (neighsh.sh != NULL) {
        if (sdest(neighsh) != pc) sesymself(neighsh);
        *searchsh = neighsh;
      } else {
        // The same reason as above. 
        // Try the next side, i.e., (startpt->pb).
        if (chkencflag) {
          // Do not cross boundary.
          if (isshsubseg(*searchsh)) {
            return ACROSSEDGE; // ACROSS_SEG
          }
        }
        spivot(*searchsh, neighsh);
        if (sorg(neighsh) != pb) sesymself(neighsh);
        senext(neighsh, *searchsh);
      }
    }
  } // while

  if (dir == SHAREEDGE) {
    if (insertsegflag) {
      // Insert the segment into the triangulation.
      face newseg;
      makeshellface(subsegs, &newseg);
      setshvertices(newseg, startpt, endpt, NULL);
      // Set the default segment marker.
      setshellmark(newseg, -1);
      ssbond(*searchsh, newseg);
      spivot(*searchsh, neighsh);
      if (neighsh.sh != NULL) {
        ssbond(neighsh, newseg);
      }
    }
    return dir;
  }

  if (dir == ACROSSVERT) {
    // A point is found collinear with this segment.
    if (reporterrorflag) {
      point pp = sdest(*searchsh);
      printf("PLC Error:  A vertex lies in a segment in facet #%d.\n",
             shellmark(*searchsh));
      printf("  Vertex:  [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
      printf("  Segment: [%d, %d]\n", pointmark(startpt), pointmark(endpt));
    }
    return dir;
  }

  if (dir == ACROSSEDGE) {
    // Edge [b, c] intersects with the segment.
    senext(*searchsh, flipshs[0]);
    if (isshsubseg(flipshs[0])) {
      if (reporterrorflag) {
        REAL P[3], Q[3], tp = 0, tq = 0;
        linelineint(startpt, endpt, pb, pc, P, Q, &tp, &tq);
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g),", 
               P[0], P[1], P[2]);
        printf(" in facet #%d.\n", shellmark(*searchsh));
        printf("  Segment 1: [%d, %d]\n", pointmark(pb), pointmark(pc));
        printf("  Segment 2: [%d, %d]\n", pointmark(startpt),pointmark(endpt));
      }
      return dir; // ACROSS_SEG
    }
    // Flip edge [b, c], queue unflipped edges (for Delaunay checks).
    spivot(flipshs[0], flipshs[1]);
    if (sorg(flipshs[1]) != sdest(flipshs[0])) sesymself(flipshs[1]);
    flip22(flipshs, 1, 0);
    // The flip may create an inverted triangle, check it.
    pa = sapex(flipshs[1]);
    pb = sapex(flipshs[0]);
    pc = sorg(flipshs[0]);
    pd = sdest(flipshs[0]);
    // Check if pa and pb are on the different sides of [pc, pd]. 
    // Re-use ori_ab, ori_ca for the tests.
    ori_ab = orient3d(pc, pd, dummypoint, pb);
    ori_ca = orient3d(pd, pc, dummypoint, pa);
    if (ori_ab <= 0) {
      flipshpush(&(flipshs[0])); 
    } else if (ori_ca <= 0) {
      flipshpush(&(flipshs[1])); 
    }
    // Set 'searchsh' s.t. its origin is 'startpt'.
    *searchsh = flipshs[0];
  }

  return sscoutsegment(searchsh, endpt, insertsegflag, reporterrorflag, 
                       chkencflag);
}